

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcursor.c
# Opt level: O0

_Bool xdpy_set_mouse_cursor(ALLEGRO_DISPLAY *display,ALLEGRO_MOUSE_CURSOR *cursor)

{
  ALLEGRO_SYSTEM_INTERFACE *pAVar1;
  undefined8 uVar2;
  ALLEGRO_SYSTEM *pAVar3;
  undefined8 *in_RSI;
  long in_RDI;
  Window xwindow;
  Display *xdisplay;
  ALLEGRO_SYSTEM_XGLX *system;
  ALLEGRO_MOUSE_CURSOR_XWIN *xcursor;
  ALLEGRO_DISPLAY_XGLX *glx;
  
  pAVar3 = al_get_system_driver();
  pAVar1 = pAVar3[1].vt;
  uVar2 = *(undefined8 *)(in_RDI + 0x280);
  *(undefined8 *)(in_RDI + 0x318) = *in_RSI;
  if ((*(byte *)(in_RDI + 800) & 1) == 0) {
    _al_mutex_lock((_AL_MUTEX *)0x200c9d);
    XDefineCursor(pAVar1,uVar2,*(undefined8 *)(in_RDI + 0x318));
    _al_mutex_unlock((_AL_MUTEX *)0x200cc8);
  }
  return true;
}

Assistant:

static bool xdpy_set_mouse_cursor(ALLEGRO_DISPLAY *display,
   ALLEGRO_MOUSE_CURSOR *cursor)
{
   ALLEGRO_DISPLAY_XGLX *glx = (ALLEGRO_DISPLAY_XGLX *)display;
   ALLEGRO_MOUSE_CURSOR_XWIN *xcursor = (ALLEGRO_MOUSE_CURSOR_XWIN *)cursor;
   ALLEGRO_SYSTEM_XGLX *system = (ALLEGRO_SYSTEM_XGLX *)al_get_system_driver();
   Display *xdisplay = system->x11display;
   Window xwindow = glx->window;

   glx->current_cursor = xcursor->cursor;

   if (!glx->cursor_hidden) {
      _al_mutex_lock(&system->lock);
      XDefineCursor(xdisplay, xwindow, glx->current_cursor);
      _al_mutex_unlock(&system->lock);
   }

   return true;
}